

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void __thiscall kj::Thread::~Thread(Thread *this)

{
  int osErrorNumber;
  Exception *pEVar1;
  undefined1 local_1e8 [8];
  Exception ecopy;
  Exception *e;
  Exception *_e102;
  Fault f;
  Type TStack_28;
  int pthreadResult;
  undefined1 local_20 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_thread_c__:95:5)>
  _kjDefer95;
  Thread *this_local;
  
  if ((this->detached & 1U) == 0) {
    TStack_28.this = this;
    _kjDefer95.maybeFunc.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_thread_c__:95:5)>_2
          )this;
    defer<kj::Thread::~Thread()::__0>((kj *)local_20,&stack0xffffffffffffffd8);
    osErrorNumber = pthread_join(this->threadId,(void **)0x0);
    if (osErrorNumber != 0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&_e102,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
                 ,99,osErrorNumber,"pthread_join","");
      kj::_::Debug::Fault::~Fault((Fault *)&_e102);
    }
    pEVar1 = kj::_::readMaybe<kj::Exception>(&this->state->exception);
    if (pEVar1 != (Exception *)0x0) {
      ecopy.details.builder.disposer = (ArrayDisposer *)pEVar1;
      pEVar1 = mv<kj::Exception>(pEVar1);
      Exception::Exception((Exception *)local_1e8,pEVar1);
      Maybe<kj::Exception>::operator=(&this->state->exception);
      pEVar1 = mv<kj::Exception>((Exception *)local_1e8);
      throwRecoverableException(pEVar1,0);
      Exception::~Exception((Exception *)local_1e8);
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++:95:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_thread_c__:95:5)>
                 *)local_20);
  }
  return;
}

Assistant:

Thread::~Thread() noexcept(false) {
  if (!detached) {
    KJ_DEFER(state->unref());

    int pthreadResult = pthread_join(*reinterpret_cast<pthread_t*>(&threadId), nullptr);
    if (pthreadResult != 0) {
      KJ_FAIL_SYSCALL("pthread_join", pthreadResult) { break; }
    }

    KJ_IF_SOME(e, state->exception) {
      Exception ecopy = kj::mv(e);
      state->exception = kj::none;  // don't complain of uncaught exception when deleting
      kj::throwRecoverableException(kj::mv(ecopy));
    }
  }
}